

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QDate calculatePosixDate(QByteArray *dateRule,int year)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int m;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  QDate QVar9;
  long ndays;
  long in_FS_OFFSET;
  QByteArrayView local_68;
  QArrayDataPointer<QByteArray> local_58;
  bool ok;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar9.jd = -0x8000000000000000;
  ok = true;
  pcVar2 = (dateRule->d).ptr;
  cVar1 = *pcVar2;
  if (cVar1 == 'J') {
    local_58.ptr = (QByteArray *)(pcVar2 + 1);
    local_58.d = (Data *)((dateRule->d).size + -1);
    uVar6 = QByteArrayView::toInt((QByteArrayView *)&local_58,&ok,10);
    uVar5 = uVar6 - 1;
    if ((0x16c < uVar5) || (ok == false)) goto LAB_003b540e;
    bVar3 = QDate::isLeapYear(year);
    uVar7 = uVar5;
    if (bVar3) {
      uVar7 = uVar6;
    }
    if (uVar6 < 0x3c) {
      uVar7 = uVar5;
    }
    QDate::QDate((QDate *)&local_58,year,1,1);
  }
  else {
    if (cVar1 == 'M') {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::split((QList<QByteArray> *)&local_58,dateRule,'.');
      if ((undefined1 *)0x2 < (ulong)local_58.size) {
        local_68.m_data = ((local_58.ptr)->d).ptr + 1;
        local_68.m_size = ((local_58.ptr)->d).size + -1;
        m = QByteArrayView::toInt(&local_68,&ok,10);
        iVar4 = 0;
        if (ok == true) {
          iVar4 = QByteArray::toInt(local_58.ptr + 1,&ok,10);
        }
        if (((ok & 1U) != 0) && (uVar5 = QByteArray::toInt(local_58.ptr + 2,&ok,10), ok == true)) {
          if (uVar5 == 0) {
            uVar5 = 7;
          }
          else if (((iVar4 - 6U < 0xfffffffb) || (m - 0xdU < 0xfffffff4)) || (7 < uVar5))
          goto LAB_003b5404;
          local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          QDate::QDate((QDate *)&local_68,year,m,1);
          iVar8 = QDate::dayOfWeek((QDate *)&local_68);
          uVar6 = uVar5 - 7;
          if ((int)uVar5 < iVar8) {
            uVar6 = uVar5;
          }
          local_68.m_size = (qsizetype)QDate::addDays((QDate *)&local_68,(long)(int)(uVar6 - iVar8))
          ;
          ndays = (long)(iVar4 * 7);
          do {
            local_68.m_size = (qsizetype)QDate::addDays((QDate *)&local_68,ndays);
            iVar4 = QDate::month((QDate *)&local_68);
            QVar9.jd = local_68.m_size;
            ndays = -7;
          } while (iVar4 != m);
        }
      }
LAB_003b5404:
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_58);
      goto LAB_003b540e;
    }
    uVar7 = QByteArray::toInt(dateRule,&ok,10);
    if ((0x16d < uVar7) || (ok == false)) goto LAB_003b540e;
    QDate::QDate((QDate *)&local_58,year,1,1);
  }
  QVar9 = QDate::addDays((QDate *)&local_58,(ulong)uVar7);
LAB_003b540e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDate)QVar9.jd;
}

Assistant:

static QDate calculatePosixDate(const QByteArray &dateRule, int year)
{
    Q_ASSERT(!dateRule.isEmpty());
    bool ok;
    // Can start with M, J, or a digit
    if (dateRule.at(0) == 'M') {
        // nth week in month format "Mmonth.week.dow"
        QList<QByteArray> dateParts = dateRule.split('.');
        if (dateParts.size() > 2) {
            Q_ASSERT(!dateParts.at(0).isEmpty()); // the 'M' is its [0].
            int month = QByteArrayView{ dateParts.at(0) }.sliced(1).toInt(&ok);
            int week = ok ? dateParts.at(1).toInt(&ok) : 0;
            int dow = ok ? dateParts.at(2).toInt(&ok) : 0;
            if (ok)
                return calculateDowDate(year, month, dow, week);
        }
    } else if (dateRule.at(0) == 'J') {
        // Day of Year 1...365, ignores Feb 29.
        // So March always starts on day 60.
        int doy = QByteArrayView{ dateRule }.sliced(1).toInt(&ok);
        if (ok && doy > 0 && doy < 366) {
            // Subtract 1 because we're adding days *after* the first of
            // January, unless it's after February in a leap year, when the leap
            // day cancels that out:
            if (!QDate::isLeapYear(year) || doy < 60)
                --doy;
            return QDate(year, 1, 1).addDays(doy);
        }
    } else {
        // Day of Year 0...365, includes Feb 29
        int doy = dateRule.toInt(&ok);
        if (ok && doy >= 0 && doy < 366)
            return QDate(year, 1, 1).addDays(doy);
    }
    return QDate();
}